

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::CwiseMultiply::dim_forward
          (Dim *__return_storage_ptr__,CwiseMultiply *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  uint *puVar10;
  invalid_argument *this_00;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  ushort uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  Dim r_1;
  Dim r;
  undefined8 uStack_1c8;
  undefined4 uStack_1c0;
  undefined4 local_1bc;
  undefined4 uStack_1b8;
  undefined8 uStack_1b4;
  uint local_1ac;
  undefined4 local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  uint local_180;
  uint local_17c;
  undefined4 local_178;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x2f6,"virtual Dim cnn::CwiseMultiply::dim_forward(const vector<Dim> &) const");
  }
  __return_storage_ptr__->bd = pDVar1->bd;
  uVar4 = *(undefined8 *)(pDVar1->d + 2);
  uVar7 = *(undefined8 *)(pDVar1->d + 4);
  uVar8 = *(undefined8 *)(pDVar1->d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar1->d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar7;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar8;
  uVar11 = (ulong)pDVar1->nd;
  uVar12 = 1;
  iVar9 = 1;
  if (uVar11 != 0) {
    auVar19 = vpbroadcastq_avx512f();
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar14 = 0;
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar23 = vmovdqa64_avx512f(auVar20);
      auVar20 = vpbroadcastq_avx512f();
      auVar24 = vporq_avx512f(auVar20,auVar21);
      auVar20 = vporq_avx512f(auVar20,auVar22);
      uVar4 = vpcmpuq_avx512f(auVar20,auVar19,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar24,auVar19,2);
      bVar6 = (byte)uVar4;
      uVar17 = CONCAT11(bVar6,bVar5);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pDVar1->d + uVar14));
      auVar24._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar20._4_4_;
      auVar24._0_4_ = (uint)(bVar5 & 1) * auVar20._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar20._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar20._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar20._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar20._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar20._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar20._28_4_;
      auVar24._32_4_ = (uint)(bVar6 & 1) * auVar20._32_4_;
      auVar24._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar20._36_4_;
      auVar24._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar20._40_4_;
      auVar24._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar20._44_4_;
      auVar24._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar20._48_4_;
      auVar24._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar20._52_4_;
      auVar24._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar20._56_4_;
      auVar24._60_4_ = (uint)(bVar6 >> 7) * auVar20._60_4_;
      auVar20 = vpmulld_avx512f(auVar24,auVar23);
      uVar14 = uVar14 + 0x10;
    } while ((uVar11 + 0xf & 0x1fffffff0) != uVar14);
    auVar19 = vmovdqa32_avx512f(auVar20);
    auVar20._0_4_ = (uint)(bVar5 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar23._0_4_;
    bVar16 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar16 * auVar19._4_4_ | (uint)!bVar16 * auVar23._4_4_;
    bVar16 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar16 * auVar19._8_4_ | (uint)!bVar16 * auVar23._8_4_;
    bVar16 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar16 * auVar19._12_4_ | (uint)!bVar16 * auVar23._12_4_;
    bVar16 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar20._16_4_ = (uint)bVar16 * auVar19._16_4_ | (uint)!bVar16 * auVar23._16_4_;
    bVar16 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar20._20_4_ = (uint)bVar16 * auVar19._20_4_ | (uint)!bVar16 * auVar23._20_4_;
    bVar16 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar20._24_4_ = (uint)bVar16 * auVar19._24_4_ | (uint)!bVar16 * auVar23._24_4_;
    bVar16 = (bool)((byte)(uVar17 >> 7) & 1);
    auVar20._28_4_ = (uint)bVar16 * auVar19._28_4_ | (uint)!bVar16 * auVar23._28_4_;
    auVar20._32_4_ = (uint)(bVar6 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar23._32_4_;
    bVar16 = (bool)(bVar6 >> 1 & 1);
    auVar20._36_4_ = (uint)bVar16 * auVar19._36_4_ | (uint)!bVar16 * auVar23._36_4_;
    bVar16 = (bool)(bVar6 >> 2 & 1);
    auVar20._40_4_ = (uint)bVar16 * auVar19._40_4_ | (uint)!bVar16 * auVar23._40_4_;
    bVar16 = (bool)(bVar6 >> 3 & 1);
    auVar20._44_4_ = (uint)bVar16 * auVar19._44_4_ | (uint)!bVar16 * auVar23._44_4_;
    bVar16 = (bool)(bVar6 >> 4 & 1);
    auVar20._48_4_ = (uint)bVar16 * auVar19._48_4_ | (uint)!bVar16 * auVar23._48_4_;
    bVar16 = (bool)(bVar6 >> 5 & 1);
    auVar20._52_4_ = (uint)bVar16 * auVar19._52_4_ | (uint)!bVar16 * auVar23._52_4_;
    bVar16 = (bool)(bVar6 >> 6 & 1);
    auVar20._56_4_ = (uint)bVar16 * auVar19._56_4_ | (uint)!bVar16 * auVar23._56_4_;
    auVar20._60_4_ =
         (uint)(bVar6 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar23._60_4_;
    auVar18 = vextracti64x4_avx512f(auVar20,1);
    auVar19 = vpmulld_avx512f(auVar20,ZEXT3264(auVar18));
    auVar2 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar9 = auVar2._0_4_;
  }
  uVar13 = iVar9 * pDVar1->bd;
  if (1 < uVar13) {
    uVar14 = 1;
    uVar15 = 1;
    do {
      if (uVar15 < uVar11) {
        bVar16 = 1 < pDVar1->d[uVar15];
      }
      else {
        bVar16 = false;
      }
      uVar15 = uVar15 + 1;
      if (bVar16) {
        uVar14 = uVar15 & 0xffffffff;
      }
      uVar12 = (uint)uVar14;
    } while (uVar13 != uVar15);
  }
  __return_storage_ptr__->nd = uVar12;
  local_198 = *(undefined8 *)__return_storage_ptr__->d;
  uStack_190 = *(undefined8 *)(__return_storage_ptr__->d + 2);
  local_188 = *(undefined8 *)(__return_storage_ptr__->d + 4);
  local_180 = __return_storage_ptr__->d[6];
  local_17c = __return_storage_ptr__->nd;
  local_178 = 1;
  uVar11 = (ulong)pDVar1[1].nd;
  uVar12 = pDVar1[1].bd;
  local_1ac = 1;
  iVar9 = 1;
  if (uVar11 != 0) {
    auVar19 = vpbroadcastq_avx512f();
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar14 = 0;
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar23 = vmovdqa64_avx512f(auVar20);
      auVar20 = vpbroadcastq_avx512f();
      auVar24 = vporq_avx512f(auVar20,auVar21);
      auVar20 = vporq_avx512f(auVar20,auVar22);
      uVar4 = vpcmpuq_avx512f(auVar20,auVar19,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar24,auVar19,2);
      bVar6 = (byte)uVar4;
      uVar17 = CONCAT11(bVar6,bVar5);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pDVar1[1].d + uVar14));
      auVar25._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar20._4_4_;
      auVar25._0_4_ = (uint)(bVar5 & 1) * auVar20._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar20._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar20._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar20._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar20._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar20._24_4_;
      auVar25._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar20._28_4_;
      auVar25._32_4_ = (uint)(bVar6 & 1) * auVar20._32_4_;
      auVar25._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar20._36_4_;
      auVar25._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar20._40_4_;
      auVar25._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar20._44_4_;
      auVar25._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar20._48_4_;
      auVar25._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar20._52_4_;
      auVar25._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar20._56_4_;
      auVar25._60_4_ = (uint)(bVar6 >> 7) * auVar20._60_4_;
      auVar20 = vpmulld_avx512f(auVar25,auVar23);
      uVar14 = uVar14 + 0x10;
    } while ((uVar11 + 0xf & 0x1fffffff0) != uVar14);
    auVar19 = vmovdqa32_avx512f(auVar20);
    auVar21._0_4_ = (uint)(bVar5 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar23._0_4_;
    bVar16 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar16 * auVar19._4_4_ | (uint)!bVar16 * auVar23._4_4_;
    bVar16 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar16 * auVar19._8_4_ | (uint)!bVar16 * auVar23._8_4_;
    bVar16 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar16 * auVar19._12_4_ | (uint)!bVar16 * auVar23._12_4_;
    bVar16 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar16 * auVar19._16_4_ | (uint)!bVar16 * auVar23._16_4_;
    bVar16 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar16 * auVar19._20_4_ | (uint)!bVar16 * auVar23._20_4_;
    bVar16 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar16 * auVar19._24_4_ | (uint)!bVar16 * auVar23._24_4_;
    bVar16 = (bool)((byte)(uVar17 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar16 * auVar19._28_4_ | (uint)!bVar16 * auVar23._28_4_;
    auVar21._32_4_ = (uint)(bVar6 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar23._32_4_;
    bVar16 = (bool)(bVar6 >> 1 & 1);
    auVar21._36_4_ = (uint)bVar16 * auVar19._36_4_ | (uint)!bVar16 * auVar23._36_4_;
    bVar16 = (bool)(bVar6 >> 2 & 1);
    auVar21._40_4_ = (uint)bVar16 * auVar19._40_4_ | (uint)!bVar16 * auVar23._40_4_;
    bVar16 = (bool)(bVar6 >> 3 & 1);
    auVar21._44_4_ = (uint)bVar16 * auVar19._44_4_ | (uint)!bVar16 * auVar23._44_4_;
    bVar16 = (bool)(bVar6 >> 4 & 1);
    auVar21._48_4_ = (uint)bVar16 * auVar19._48_4_ | (uint)!bVar16 * auVar23._48_4_;
    bVar16 = (bool)(bVar6 >> 5 & 1);
    auVar21._52_4_ = (uint)bVar16 * auVar19._52_4_ | (uint)!bVar16 * auVar23._52_4_;
    bVar16 = (bool)(bVar6 >> 6 & 1);
    auVar21._56_4_ = (uint)bVar16 * auVar19._56_4_ | (uint)!bVar16 * auVar23._56_4_;
    auVar21._60_4_ =
         (uint)(bVar6 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar23._60_4_;
    auVar18 = vextracti64x4_avx512f(auVar21,1);
    auVar19 = vpmulld_avx512f(auVar21,ZEXT3264(auVar18));
    auVar2 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar9 = auVar2._0_4_;
  }
  uVar13 = iVar9 * uVar12;
  if (1 < uVar13) {
    local_1ac = 1;
    uVar14 = 0;
    do {
      uVar15 = uVar14 + 1;
      if (uVar15 < uVar11) {
        bVar16 = 1 < pDVar1[1].d[uVar14 + 1];
      }
      else {
        bVar16 = false;
      }
      if (bVar16) {
        local_1ac = (int)uVar14 + 2;
      }
      uVar14 = uVar15;
    } while ((ulong)uVar13 - 1 != uVar15);
  }
  uStack_1c8 = *(undefined8 *)pDVar1[1].d;
  uStack_1b4 = *(undefined8 *)(pDVar1[1].d + 5);
  uStack_1b8 = (undefined4)((ulong)*(undefined8 *)(pDVar1[1].d + 3) >> 0x20);
  uStack_1c0 = (undefined4)*(undefined8 *)(pDVar1[1].d + 2);
  local_1bc = (undefined4)((ulong)*(undefined8 *)(pDVar1[1].d + 2) >> 0x20);
  local_1a8 = 1;
  if ((local_17c == local_1ac) &&
     (iVar9 = bcmp(&local_198,&uStack_1c8,(ulong)local_17c), iVar9 == 0)) {
    puVar10 = &__return_storage_ptr__->bd;
    if (__return_storage_ptr__->bd <= uVar12) {
      puVar10 = &pDVar1[1].bd;
    }
    __return_storage_ptr__->bd = *puVar10;
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Mismatched input dimensions in CwiseMultiply: ",0x2e);
  operator<<((ostream *)&local_198,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,(string *)&uStack_1c8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}